

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::ConcatArgs<unsigned_int>
               (RecyclableObject *pDestObj,TypeId *remoteTypeIds,Arguments *args,
               ScriptContext *scriptContext,uint start,uint startIdxDest,
               ConcatSpreadableState previousItemSpreadableState,BigIndex *firstPromotedItemLength)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  PropertyId PVar5;
  uint uVar6;
  uint32 uVar7;
  ThreadContext *threadContext;
  ScriptConfiguration *this;
  undefined4 *puVar8;
  JavascriptArray *pJVar9;
  JavascriptArray *srcArray;
  RecyclableObject *instance;
  Var pvVar10;
  uint64 uVar11;
  char *pcVar12;
  undefined4 in_register_00000084;
  ulong uVar13;
  BigIndex index;
  BigIndex BVar14;
  uint local_278;
  JavascriptNativeFloatArray *local_218;
  JavascriptNativeIntArray *local_1f0;
  byte local_1bd;
  PropertyRecord *pPStack_178;
  BOOL hasProp;
  PropertyRecord *propertyRecord;
  BigIndex idxSubItem_1;
  uint local_158;
  BOOL hasItem;
  uint32 idxSubItem;
  uint32 lengthToUin32Max;
  Var subItem;
  RecyclableObject *itemObject;
  BigIndex local_130;
  undefined4 local_11c;
  char *local_118;
  undefined1 auStack_110 [16];
  undefined1 auStack_100 [16];
  BigIndex length;
  JavascriptArray *pItemArray;
  JavascriptNativeFloatArray *local_c0;
  JavascriptNativeFloatArray *pFloatItemArray;
  JavascriptNativeIntArray *local_a8;
  JavascriptNativeIntArray *pIntItemArray;
  byte local_89;
  Var pvStack_88;
  bool spreadable;
  Var aItem;
  uint local_78;
  uint idxArg;
  uint idxDest;
  JavascriptArray *local_68;
  JavascriptArray *pDestArray;
  JsReentLock jsReentLock;
  uint startIdxDest_local;
  uint start_local;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  TypeId *remoteTypeIds_local;
  RecyclableObject *pDestObj_local;
  
  uVar13 = CONCAT44(in_register_00000084,start);
  jsReentLock._24_4_ = startIdxDest;
  jsReentLock._28_4_ = start;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&pDestArray,threadContext);
  local_68 = TryVarToNonES5Array(pDestObj);
  if (local_68 != (JavascriptArray *)0x0) {
    local_68 = EnsureNonNativeArray(local_68);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)&pDestArray,local_68);
  }
  this = ScriptContext::GetConfig(scriptContext);
  bVar2 = ScriptConfiguration::IsES6IsConcatSpreadableEnabled(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xcb4,
                                "(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())",
                                "scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  local_78 = jsReentLock._24_4_;
  aItem._4_4_ = jsReentLock._28_4_;
  do {
    pcVar12 = (char *)((ulong)args->Info & 0xffffff);
    if ((uint)pcVar12 <= aItem._4_4_) {
      if (local_68 == (JavascriptArray *)0x0) {
        JsReentLock::unlock((JsReentLock *)&pDestArray);
        pvVar10 = ConvertToIndex<unsigned_int,void*>(local_78,scriptContext);
        (*(pDestObj->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x17])(pDestObj,0xd1,pvVar10,0,0);
        JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
        JsReentLock::relock((JsReentLock *)&pDestArray);
      }
      else {
        uVar4 = ArrayObject::GetLength(&local_68->super_ArrayObject);
        uVar7 = ConvertToIndex<unsigned_int,unsigned_int>(local_78,scriptContext);
        pJVar9 = local_68;
        if (uVar4 != uVar7) {
          uVar4 = ConvertToIndex<unsigned_int,unsigned_int>(local_78,scriptContext);
          SetLength(pJVar9,uVar4);
        }
      }
      local_11c = 0;
LAB_010ebd5f:
      JsReentLock::~JsReentLock((JsReentLock *)&pDestArray);
      return;
    }
    pvStack_88 = Arguments::operator[](args,aItem._4_4_);
    JsReentLock::setObjectForMutation((JsReentLock *)&pDestArray,pvStack_88);
    local_89 = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;
    if (previousItemSpreadableState == ConcatSpreadableState_NotChecked) {
      JsReentLock::unlock((JsReentLock *)&pDestArray);
      BVar3 = Js::JavascriptOperators::IsConcatSpreadable(pvStack_88);
      local_89 = BVar3 != 0;
      JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
      JsReentLock::relock((JsReentLock *)&pDestArray);
    }
    previousItemSpreadableState = ConcatSpreadableState_NotChecked;
    if ((local_89 & 1) == 0) {
      JsReentLock::unlock((JsReentLock *)&pDestArray);
      uVar13 = (ulong)local_78;
      SetConcatItem<unsigned_int>(pvStack_88,aItem._4_4_,local_68,pDestObj,local_78,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
      JsReentLock::relock((JsReentLock *)&pDestArray);
      local_78 = local_78 + 1;
    }
    else {
      local_1bd = 0;
      if (local_68 != (JavascriptArray *)0x0) {
        bVar2 = IsDirectAccessArray(pvStack_88);
        pcVar12 = (char *)CONCAT71((int7)((ulong)pcVar12 >> 8),bVar2);
        local_1bd = 0;
        if (bVar2) {
          bVar2 = IsDirectAccessArray(local_68);
          uVar6 = local_78;
          pcVar12 = (char *)CONCAT71((int7)((ulong)pcVar12 >> 8),bVar2);
          local_1bd = 0;
          if (bVar2) {
            pJVar9 = UnsafeVarTo<Js::JavascriptArray>(pvStack_88);
            BigIndex::BigIndex((BigIndex *)&pIntItemArray,uVar6 + (pJVar9->super_ArrayObject).length
                              );
            bVar2 = BigIndex::IsSmallIndex((BigIndex *)&pIntItemArray);
            pcVar12 = (char *)CONCAT71((int7)((ulong)pcVar12 >> 8),bVar2);
            local_1bd = 0;
            if (bVar2) {
              pJVar9 = UnsafeVarTo<Js::JavascriptArray>(pvStack_88);
              bVar2 = IsFillFromPrototypes(pJVar9);
              local_1bd = bVar2 ^ 0xff;
            }
          }
        }
      }
      pvVar10 = pvStack_88;
      if ((local_1bd & 1) == 0) {
        bVar2 = VarIs<Js::RecyclableObject>(pvStack_88);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          pcVar12 = "VarIs<RecyclableObject>(aItem)";
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0xce8,"(VarIs<RecyclableObject>(aItem))",
                                      "VarIs<RecyclableObject>(aItem)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BigIndex::BigIndex((BigIndex *)(auStack_100 + 8),0);
        if (firstPromotedItemLength == (BigIndex *)0x0) {
          JsReentLock::unlock((JsReentLock *)&pDestArray);
          uVar11 = OP_GetLength(pvStack_88,scriptContext);
          BigIndex::BigIndex((BigIndex *)(auStack_110 + 8),uVar11);
          auStack_100._8_8_ = auStack_110._8_8_;
          length._0_8_ = auStack_100._0_8_;
          JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
          JsReentLock::relock((JsReentLock *)&pDestArray);
        }
        else {
          pcVar12 = *(char **)firstPromotedItemLength;
          length._0_8_ = firstPromotedItemLength->bigIndex;
          auStack_100._8_8_ = pcVar12;
        }
        local_118 = (char *)auStack_100._8_8_;
        auStack_110._0_8_ = length._0_8_;
        BVar14.bigIndex._0_4_ = local_78;
        BVar14.index = length.index;
        BVar14._4_4_ = length._4_4_;
        BVar14.bigIndex._4_4_ = 0;
        bVar2 = PromoteToBigIndex((JavascriptArray *)(auStack_100._8_8_ & 0xffffffff),BVar14,
                                  (uint32)pcVar12);
        if (bVar2) {
          JsReentLock::unlock((JsReentLock *)&pDestArray);
          ConcatArgs<Js::JavascriptArray::BigIndex>
                    (pDestObj,remoteTypeIds,args,scriptContext,aItem._4_4_,local_78,
                     ConcatSpreadableState_CheckedAndTrue,(BigIndex *)(auStack_100 + 8));
          JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
          JsReentLock::relock((JsReentLock *)&pDestArray);
          local_11c = 1;
          goto LAB_010ebd5f;
        }
        BVar14 = BigIndex::operator+((BigIndex *)(auStack_100 + 8),local_78);
        local_130.bigIndex = BVar14.bigIndex;
        local_130.index = BVar14.index;
        BigIndex::BigIndex((BigIndex *)&itemObject,0x1fffffffffffff);
        bVar2 = BigIndex::operator>(&local_130,(BigIndex *)&itemObject);
        if (bVar2) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec09,(PCWSTR)0x0);
        }
        instance = VarTo<Js::RecyclableObject>(pvStack_88);
        bVar2 = BigIndex::IsSmallIndex((BigIndex *)(auStack_100 + 8));
        if (bVar2) {
          local_278 = BigIndex::GetSmallIndex((BigIndex *)(auStack_100 + 8));
        }
        else {
          local_278 = 0xffffffff;
        }
        for (local_158 = 0; local_158 < local_278; local_158 = local_158 + 1) {
          JsReentLock::unlock((JsReentLock *)&pDestArray);
          idxSubItem_1.bigIndex._4_4_ = Js::JavascriptOperators::HasItem(instance,local_158);
          JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
          JsReentLock::relock((JsReentLock *)&pDestArray);
          if (idxSubItem_1.bigIndex._4_4_ != 0) {
            JsReentLock::unlock((JsReentLock *)&pDestArray);
            pvVar10 = Js::JavascriptOperators::GetItem(instance,local_158,scriptContext);
            JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
            JsReentLock::relock((JsReentLock *)&pDestArray);
            if (local_68 == (JavascriptArray *)0x0) {
              JsReentLock::unlock((JsReentLock *)&pDestArray);
              BVar3 = SetArrayLikeObjects(pDestObj,local_78,pvVar10);
              ThrowErrorOnFailure(BVar3,scriptContext,local_78);
              JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
              JsReentLock::relock((JsReentLock *)&pDestArray);
            }
            else {
              GenericDirectSetItemAt(local_68,local_78,pvVar10);
            }
          }
          local_78 = local_78 + 1;
        }
        BigIndex::BigIndex((BigIndex *)&propertyRecord,0xffffffff);
        while (bVar2 = BigIndex::operator<((BigIndex *)&propertyRecord,(BigIndex *)(auStack_100 + 8)
                                          ), bVar2) {
          uVar11 = BigIndex::GetBigIndex((BigIndex *)&propertyRecord);
          Js::JavascriptOperators::GetPropertyIdForInt
                    (uVar11,scriptContext,&stack0xfffffffffffffe88);
          JsReentLock::unlock((JsReentLock *)&pDestArray);
          PVar5 = PropertyRecord::GetPropertyId(pPStack_178);
          BVar3 = Js::JavascriptOperators::HasProperty(instance,PVar5);
          JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
          JsReentLock::relock((JsReentLock *)&pDestArray);
          if (BVar3 != 0) {
            JsReentLock::unlock((JsReentLock *)&pDestArray);
            PVar5 = PropertyRecord::GetPropertyId(pPStack_178);
            pvVar10 = Js::JavascriptOperators::GetProperty
                                (instance,PVar5,scriptContext,(PropertyValueInfo *)0x0);
            JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
            JsReentLock::relock((JsReentLock *)&pDestArray);
            if (local_68 == (JavascriptArray *)0x0) {
              JsReentLock::unlock((JsReentLock *)&pDestArray);
              uVar6 = SetArrayLikeObjects(pDestObj,local_78,pvVar10);
              index.bigIndex = uVar13;
              index.index = idxSubItem_1.index;
              index._4_4_ = idxSubItem_1._4_4_;
              ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar6,(BOOL)scriptContext,
                                  (ScriptContext *)((ulong)propertyRecord & 0xffffffff),index);
              JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
              JsReentLock::relock((JsReentLock *)&pDestArray);
            }
            else {
              GenericDirectSetItemAt(local_68,local_78,pvVar10);
            }
          }
          local_78 = local_78 + 1;
          BigIndex::operator++((BigIndex *)&propertyRecord);
        }
      }
      else {
        bVar2 = VarIs<Js::JavascriptNativeIntArray>(pvStack_88);
        if (bVar2) {
          local_1f0 = UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar10);
        }
        else {
          local_1f0 = (JavascriptNativeIntArray *)0x0;
        }
        pvVar10 = pvStack_88;
        local_a8 = local_1f0;
        if (local_1f0 == (JavascriptNativeIntArray *)0x0) {
          bVar2 = VarIs<Js::JavascriptNativeFloatArray>(pvStack_88);
          if (bVar2) {
            local_218 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(pvVar10);
          }
          else {
            local_218 = (JavascriptNativeFloatArray *)0x0;
          }
          local_c0 = local_218;
          if (local_218 == (JavascriptNativeFloatArray *)0x0) {
            srcArray = UnsafeVarTo<Js::JavascriptArray>(pvStack_88);
            JsReentLock::unlock((JsReentLock *)&pDestArray);
            pJVar9 = local_68;
            BigIndex::BigIndex((BigIndex *)&length.bigIndex,local_78);
            uVar4 = BigIndex::GetSmallIndex((BigIndex *)&length.bigIndex);
            uVar13 = 0xffffffff;
            CopyArrayElements(pJVar9,uVar4,srcArray,0,0xffffffff);
            JsReentLock::MutateArrayObject((JsReentLock *)&pDestArray);
            JsReentLock::relock((JsReentLock *)&pDestArray);
            local_78 = local_78 + (srcArray->super_ArrayObject).length;
          }
          else {
            JsReentLock::unlock((JsReentLock *)&pDestArray);
            pJVar9 = local_68;
            BigIndex::BigIndex((BigIndex *)&pItemArray,local_78);
            uVar4 = BigIndex::GetSmallIndex((BigIndex *)&pItemArray);
            uVar13 = 0xffffffff;
            CopyNativeFloatArrayElementsToVar(pJVar9,uVar4,local_c0,0,0xffffffff);
            JsReentLock::relock((JsReentLock *)&pDestArray);
            local_78 = local_78 +
                       (local_c0->super_JavascriptNativeArray).super_JavascriptArray.
                       super_ArrayObject.length;
          }
        }
        else {
          JsReentLock::unlock((JsReentLock *)&pDestArray);
          pJVar9 = local_68;
          BigIndex::BigIndex((BigIndex *)&pFloatItemArray,local_78);
          uVar4 = BigIndex::GetSmallIndex((BigIndex *)&pFloatItemArray);
          uVar13 = 0xffffffff;
          CopyNativeIntArrayElementsToVar(pJVar9,uVar4,local_a8,0,0xffffffff);
          JsReentLock::relock((JsReentLock *)&pDestArray);
          local_78 = local_78 +
                     (local_a8->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject
                     .length;
        }
      }
      firstPromotedItemLength = (BigIndex *)0x0;
    }
    aItem._4_4_ = aItem._4_4_ + 1;
  } while( true );
}

Assistant:

void JavascriptArray::ConcatArgs(RecyclableObject* pDestObj, TypeId* remoteTypeIds,
        Js::Arguments& args, ScriptContext* scriptContext, uint start, uint startIdxDest,
        ConcatSpreadableState previousItemSpreadableState /*= ConcatSpreadableState_NotChecked*/, BigIndex *firstPromotedItemLength /* = nullptr */)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray* pDestArray = JavascriptArray::TryVarToNonES5Array(pDestObj);
        if (pDestArray)
        {
            // ConcatArgs function expects to work on the Var array so we are ensuring it.
            pDestArray = EnsureNonNativeArray(pDestArray);
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pDestArray);
        }

        AssertOrFailFast(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()); // ConcatSpreadable is enabled already - not going back.

        T idxDest = startIdxDest;
        for (uint idxArg = start; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
            SETOBJECT_FOR_MUTATION(jsReentLock, aItem);

            bool spreadable = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;

            if (previousItemSpreadableState == ConcatSpreadableState_NotChecked)
            {
                JS_REENTRANT(jsReentLock, spreadable = !!JavascriptOperators::IsConcatSpreadable(aItem));
            }

            // Reset the state for the next item in the array
            previousItemSpreadableState = ConcatSpreadableState_NotChecked;

            if (!spreadable)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::SetConcatItem<T>(aItem, idxArg, pDestArray, pDestObj, idxDest, scriptContext));
                ++idxDest;
                continue;
            }

            if (pDestArray && JavascriptArray::IsDirectAccessArray(aItem) && JavascriptArray::IsDirectAccessArray(pDestArray)
                && BigIndex(idxDest + UnsafeVarTo<JavascriptArray>(aItem)->length).IsSmallIndex() && !UnsafeVarTo<JavascriptArray>(aItem)->IsFillFromPrototypes()) // Fast path
            {
                JavascriptNativeIntArray *pIntItemArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(aItem);
                if (pIntItemArray)
                {
                    JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeIntArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pIntItemArray));
                    idxDest = idxDest + pIntItemArray->length;
                }
                else
                {
                    JavascriptNativeFloatArray *pFloatItemArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(aItem);
                    if (pFloatItemArray)
                    {
                        JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeFloatArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pFloatItemArray));
                        idxDest = idxDest + pFloatItemArray->length;
                    }
                    else
                    {
                        JavascriptArray* pItemArray = UnsafeVarTo<JavascriptArray>(aItem);
                        JS_REENTRANT(jsReentLock, CopyArrayElements(pDestArray, BigIndex(idxDest).GetSmallIndex(), pItemArray));
                        idxDest = idxDest + pItemArray->length;
                    }
                }
            }
            else
            {
                AssertOrFailFast(VarIs<RecyclableObject>(aItem));

                //CONSIDER: enumerating remote array instead of walking all indices
                BigIndex length;
                if (firstPromotedItemLength != nullptr)
                {
                    length = *firstPromotedItemLength;
                }
                else
                {
                    JS_REENTRANT(jsReentLock, length = OP_GetLength(aItem, scriptContext));
                }

                if (PromoteToBigIndex(length, idxDest))
                {
                    // This is a special case for spreadable objects. We do not pre-calculate the length
                    // in EntryConcat like we do with Arrays because a getProperty on an object Length
                    // is observable. The result is we have to check for overflows separately for
                    // spreadable objects and promote to a bigger index type when we find them.
                    JS_REENTRANT(jsReentLock, ConcatArgs<BigIndex>(pDestObj, remoteTypeIds, args, scriptContext, idxArg, idxDest, ConcatSpreadableState_CheckedAndTrue, &length));
                    return;
                }

                if (length + idxDest > FiftyThirdPowerOfTwoMinusOne) // 2^53-1: from ECMA 22.1.3.1 Array.prototype.concat(...arguments)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_IllegalArraySizeAndLength);
                }

                RecyclableObject* itemObject = VarTo<RecyclableObject>(aItem);
                Var subItem;
                uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
                for (uint32 idxSubItem = 0u; idxSubItem < lengthToUin32Max; ++idxSubItem)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(itemObject, idxSubItem));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetItem(itemObject, idxSubItem, scriptContext));

                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxDest));
                        }
                    }
                    ++idxDest;
                }

                for (BigIndex idxSubItem = MaxArrayLength; idxSubItem < length; ++idxSubItem)
                {
                    PropertyRecord const * propertyRecord;
                    JavascriptOperators::GetPropertyIdForInt(idxSubItem.GetBigIndex(), scriptContext, &propertyRecord);
                    JS_REENTRANT(jsReentLock, BOOL hasProp = JavascriptOperators::HasProperty(itemObject, propertyRecord->GetPropertyId()));
                    if (hasProp)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetProperty(itemObject, propertyRecord->GetPropertyId(), scriptContext));
                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxSubItem));
                        }
                    }
                    ++idxDest;
                }
            }

            firstPromotedItemLength = nullptr;
        }

        if (!pDestArray)
        {
            JS_REENTRANT(jsReentLock, pDestObj->SetProperty(PropertyIds::length, ConvertToIndex<T, Var>(idxDest, scriptContext), Js::PropertyOperation_None, nullptr));
        }
        else if (pDestArray->GetLength() != ConvertToIndex<T, uint32>(idxDest, scriptContext))
        {
            pDestArray->SetLength(ConvertToIndex<T, uint32>(idxDest, scriptContext));
        }
    }